

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * __thiscall tcu::Format::Hex<4UL>::toStream(Hex<4UL> *this,ostream *stream)

{
  ostream *poVar1;
  string local_30;
  
  Hex<4ul>::toString_abi_cxx11_(&local_30,this);
  poVar1 = std::operator<<(stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& toStream (std::ostream& stream) const
	{
		return stream << this->toString();
	}